

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

void __thiscall QColorDialogPrivate::initWidgets(QColorDialogPrivate *this)

{
  QWidget *parent;
  QWellArray *pQVar1;
  QVBoxLayout *this_00;
  bool bVar2;
  int iVar3;
  QLayout *this_01;
  QLayout *pQVar4;
  int extraout_var;
  QColorWell *pQVar5;
  QRgb *pQVar6;
  QLabel *pQVar7;
  undefined4 *puVar8;
  QLayout *pQVar9;
  QLayout *layout;
  QColorPicker *this_02;
  QColorLuminancePicker *this_03;
  QColorShower *this_04;
  QWidget *pQVar10;
  QPushButton *pQVar11;
  int extraout_EDX;
  int extraout_var_00;
  QColorDialogPrivate *this_05;
  ConnectionType CVar12;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QMargins QVar13;
  ulong uVar14;
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  undefined1 local_80 [32];
  undefined1 local_60 [8];
  QArrayDataPointer<char16_t> local_58;
  undefined1 local_40 [16];
  
  local_40._8_8_ = *(long *)(in_FS_OFFSET + 0x28);
  parent = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  this_01 = (QLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout((QVBoxLayout *)this_01,parent);
  QLayout::setSizeConstraint(this_01,SetFixedSize);
  pQVar4 = (QLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout((QHBoxLayout *)pQVar4);
  QBoxLayout::addLayout((QBoxLayout *)this_01,pQVar4,0);
  this->leftLay = (QVBoxLayout *)0x0;
  QGuiApplication::primaryScreen();
  iVar3 = QScreen::virtualGeometry();
  bVar2 = true;
  if (0x1df < (extraout_EDX - iVar3) + 1) {
    QGuiApplication::primaryScreen();
    QScreen::virtualGeometry();
    bVar2 = (extraout_var_00 - extraout_var) + 1 < 0x15e;
  }
  this->smallDisplay = bVar2;
  iVar3 = (**(code **)(*(long *)pQVar4 + 0x60))(pQVar4);
  CVar12 = (ConnectionType)this;
  if (this->smallDisplay == false) {
    pQVar9 = (QLayout *)operator_new(0x20);
    QVBoxLayout::QVBoxLayout((QVBoxLayout *)pQVar9);
    this->leftLay = (QVBoxLayout *)pQVar9;
    QBoxLayout::addLayout((QBoxLayout *)pQVar4,pQVar9,0);
    pQVar5 = (QColorWell *)operator_new(0x68);
    pQVar6 = (QRgb *)QColorDialogOptions::standardColors();
    QtPrivate::QColorWell::QColorWell(pQVar5,parent,6,8,pQVar6);
    this->standard = (QWellArray *)pQVar5;
    pQVar7 = (QLabel *)operator_new(0x28);
    QLabel::QLabel(pQVar7,parent,(WindowFlags)0x0);
    this->lblBasicColors = pQVar7;
    QLabel::setBuddy(pQVar7,&this->standard->super_QWidget);
    local_58._0_16_ = ZEXT816(0x48d9d0);
    QObjectPrivate::
    connect<void(QtPrivate::QWellArray::*)(int,int),void(QColorDialogPrivate::*)(int,int)>
              ((Object *)local_40,(offset_in_QWellArray_to_subr)this->standard,
               (Object *)QtPrivate::QWellArray::selected,0,CVar12);
    QMetaObject::Connection::~Connection((Connection *)local_40);
    QBoxLayout::addWidget
              (&this->leftLay->super_QBoxLayout,(QWidget *)this->lblBasicColors,0,(Alignment)0x0);
    this_05 = (QColorDialogPrivate *)this->leftLay;
    QBoxLayout::addWidget((QBoxLayout *)this_05,&this->standard->super_QWidget,0,(Alignment)0x0);
    bVar2 = supportsColorPicking(this_05);
    if (bVar2) {
      pQVar10 = (QWidget *)operator_new(0x28);
      QPushButton::QPushButton((QPushButton *)pQVar10,(QWidget *)0x0);
      this->eyeDropperButton = (QPushButton *)pQVar10;
      QBoxLayout::addWidget(&this->leftLay->super_QBoxLayout,pQVar10,0,(Alignment)0x0);
      pQVar7 = (QLabel *)operator_new(0x28);
      latin1.m_data = "\n";
      latin1.m_size = 1;
      QString::QString((QString *)&local_58,latin1);
      QLabel::QLabel(pQVar7,(QString *)&local_58,(QWidget *)0x0,(WindowFlags)0x0);
      this->lblScreenColorInfo = pQVar7;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      QBoxLayout::addWidget
                (&this->leftLay->super_QBoxLayout,(QWidget *)this->lblScreenColorInfo,0,
                 (Alignment)0x0);
      local_58._0_16_ = ZEXT816(0x48db4c);
      QObjectPrivate::connect<void(QAbstractButton::*)(bool),void(QColorDialogPrivate::*)()>
                ((Object *)local_60,(offset_in_QAbstractButton_to_subr)this->eyeDropperButton,
                 (Object *)QAbstractButton::clicked,0,CVar12);
      QMetaObject::Connection::~Connection((Connection *)local_60);
    }
    else {
      this->eyeDropperButton = (QPushButton *)0x0;
      this->lblScreenColorInfo = (QLabel *)0x0;
    }
    QBoxLayout::addStretch(&this->leftLay->super_QBoxLayout,0);
    pQVar5 = (QColorWell *)operator_new(0x68);
    pQVar6 = (QRgb *)QColorDialogOptions::customColors();
    QtPrivate::QColorWell::QColorWell(pQVar5,parent,2,8,pQVar6);
    this->custom = (QWellArray *)pQVar5;
    QWidget::setAcceptDrops((QWidget *)pQVar5,true);
    local_58._0_16_ = ZEXT816(0x48da0c);
    QObjectPrivate::
    connect<void(QtPrivate::QWellArray::*)(int,int),void(QColorDialogPrivate::*)(int,int)>
              ((Object *)(local_80 + 0x18),(offset_in_QWellArray_to_subr)this->custom,
               (Object *)QtPrivate::QWellArray::selected,0,CVar12);
    QMetaObject::Connection::~Connection((Connection *)(local_80 + 0x18));
    local_58._0_16_ = ZEXT816(0x48db3e);
    uVar14 = 0;
    QObjectPrivate::
    connect<void(QtPrivate::QWellArray::*)(int,int),void(QColorDialogPrivate::*)(int,int)>
              ((Object *)(local_80 + 0x10),(offset_in_QWellArray_to_subr)this->custom,
               (Object *)QtPrivate::QWellArray::currentChanged,0,CVar12);
    QMetaObject::Connection::~Connection((Connection *)(local_80 + 0x10));
    pQVar1 = this->custom;
    local_58._0_16_ = ZEXT816(0x48b1a2);
    puVar8 = (undefined4 *)operator_new(0x18);
    *puVar8 = 1;
    *(code **)(puVar8 + 2) =
         QtPrivate::
         QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/dialogs/qcolordialog.cpp:1768:64),_QtPrivate::List<int,_unsigned_int>,_void>
         ::impl;
    *(QColorDialogPrivate **)(puVar8 + 4) = this;
    QObject::connectImpl
              ((QObject *)(local_80 + 8),(void **)pQVar1,(QObject *)&local_58,(void **)parent,
               (QSlotObjectBase *)0x0,(ConnectionType)puVar8,(int *)(uVar14 & 0xffffffff00000000),
               (QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)(local_80 + 8));
    pQVar7 = (QLabel *)operator_new(0x28);
    QLabel::QLabel(pQVar7,parent,(WindowFlags)0x0);
    this->lblCustomColors = pQVar7;
    QLabel::setBuddy(pQVar7,&this->custom->super_QWidget);
    QBoxLayout::addWidget
              (&this->leftLay->super_QBoxLayout,(QWidget *)this->lblCustomColors,0,(Alignment)0x0);
    QBoxLayout::addWidget
              (&this->leftLay->super_QBoxLayout,&this->custom->super_QWidget,0,(Alignment)0x0);
    pQVar11 = (QPushButton *)operator_new(0x28);
    QPushButton::QPushButton(pQVar11,parent);
    this->addCusBt = pQVar11;
    local_58._0_16_ = ZEXT816(0x48e8b8);
    QObjectPrivate::connect<void(QAbstractButton::*)(bool),void(QColorDialogPrivate::*)()>
              ((Object *)local_80,(offset_in_QAbstractButton_to_subr)pQVar11,
               (Object *)QAbstractButton::clicked,0,CVar12);
    QMetaObject::Connection::~Connection((Connection *)local_80);
    QBoxLayout::addWidget
              (&this->leftLay->super_QBoxLayout,(QWidget *)this->addCusBt,0,(Alignment)0x0);
  }
  else {
    pWidth = 1;
    pHeight = 1;
    this->custom = (QWellArray *)0x0;
    this->standard = (QWellArray *)0x0;
  }
  pQVar9 = (QLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout((QVBoxLayout *)pQVar9);
  QBoxLayout::addLayout((QBoxLayout *)pQVar4,pQVar9,0);
  pQVar4 = (QLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout((QHBoxLayout *)pQVar4);
  QBoxLayout::addLayout((QBoxLayout *)pQVar9,pQVar4,0);
  layout = (QLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout((QVBoxLayout *)layout);
  QBoxLayout::addLayout((QBoxLayout *)pQVar4,layout,0);
  this_02 = (QColorPicker *)operator_new(0x50);
  QtPrivate::QColorPicker::QColorPicker(this_02,parent);
  this->cp = this_02;
  QFrame::setFrameStyle((QFrame *)this_02,0x32);
  QBoxLayout::addSpacing((QBoxLayout *)layout,iVar3 / 2);
  QBoxLayout::addWidget((QBoxLayout *)layout,(QWidget *)this->cp,0,(Alignment)0x0);
  QBoxLayout::addSpacing((QBoxLayout *)layout,iVar3 / 2);
  this_03 = (QColorLuminancePicker *)operator_new(0x40);
  QtPrivate::QColorLuminancePicker::QColorLuminancePicker(this_03,parent);
  this->lp = this_03;
  QWidget::setFixedWidth((QWidget *)this_03,0x14);
  QBoxLayout::addSpacing((QBoxLayout *)pQVar4,10);
  QBoxLayout::addWidget((QBoxLayout *)pQVar4,&this->lp->super_QWidget,0,(Alignment)0x0);
  QBoxLayout::addStretch((QBoxLayout *)pQVar4,0);
  local_58._0_16_ = ZEXT816(0x48b49e);
  QObject::
  connect<void(QtPrivate::QColorPicker::*)(int,int),void(QtPrivate::QColorLuminancePicker::*)(int,int)>
            ((Object *)(local_90 + 8),(offset_in_QColorPicker_to_subr)this->cp,
             (ContextType *)QtPrivate::QColorPicker::newCol,
             (offset_in_QColorLuminancePicker_to_subr *)0x0,(ConnectionType)this->lp);
  QMetaObject::Connection::~Connection((Connection *)(local_90 + 8));
  local_58._0_16_ = ZEXT816(0x48d6f2);
  QObjectPrivate::
  connect<void(QtPrivate::QColorLuminancePicker::*)(int,int,int),void(QColorDialogPrivate::*)(int,int,int)>
            ((Object *)local_90,(offset_in_QColorLuminancePicker_to_subr)this->lp,
             (Object *)QtPrivate::QColorLuminancePicker::newHsv,0,CVar12);
  QMetaObject::Connection::~Connection((Connection *)local_90);
  QBoxLayout::addStretch((QBoxLayout *)pQVar9,0);
  this_04 = (QColorShower *)operator_new(0xe8);
  QtPrivate::QColorShower::QColorShower(this_04,(QColorDialog *)parent);
  this->cs = this_04;
  local_58._0_16_ = QLayout::contentsMargins(&this_04->gl->super_QLayout);
  QLayout::setContentsMargins(pQVar4,(QMargins *)&local_58);
  local_58._0_16_ = ZEXT816(0x48d780);
  QObjectPrivate::
  connect<void(QtPrivate::QColorShower::*)(unsigned_int),void(QColorDialogPrivate::*)(unsigned_int)>
            ((Object *)(local_a0 + 8),(offset_in_QColorShower_to_subr)this->cs,
             (Object *)QtPrivate::QColorShower::newCol,0,CVar12);
  QMetaObject::Connection::~Connection((Connection *)(local_a0 + 8));
  local_58.ptr = (char16_t *)0x0;
  local_58.d = (Data *)QColorDialog::currentColorChanged;
  CVar12 = (ConnectionType)parent;
  QObject::
  connect<void(QtPrivate::QColorShower::*)(QColor_const&),void(QColorDialog::*)(QColor_const&)>
            ((Object *)local_a0,(offset_in_QColorShower_to_subr)this->cs,
             (ContextType *)QtPrivate::QColorShower::currentColorChanged,
             (offset_in_QColorDialog_to_subr *)0x0,CVar12);
  QMetaObject::Connection::~Connection((Connection *)local_a0);
  QBoxLayout::addWidget((QBoxLayout *)pQVar9,&this->cs->super_QWidget,0,(Alignment)0x0);
  this_00 = this->leftLay;
  if (this_00 != (QVBoxLayout *)0x0) {
    QVar13 = QLayout::contentsMargins(&this->cs->gl->super_QLayout);
    QBoxLayout::addSpacing(&this_00->super_QBoxLayout,QVar13.m_right.m_i.m_i);
  }
  pQVar10 = (QWidget *)operator_new(0x28);
  QDialogButtonBox::QDialogButtonBox((QDialogButtonBox *)pQVar10,parent);
  this->buttons = (QDialogButtonBox *)pQVar10;
  QBoxLayout::addWidget((QBoxLayout *)this_01,pQVar10,0,(Alignment)0x0);
  pQVar11 = QDialogButtonBox::addButton((QDialogButtonBox *)this->buttons,FirstButton);
  this->ok = pQVar11;
  local_58._0_16_ = ZEXT816(0x1b9);
  QObject::connect<void(QAbstractButton::*)(bool),void(QDialog::*)()>
            ((Object *)(local_b0 + 8),(offset_in_QAbstractButton_to_subr)pQVar11,
             (ContextType *)QAbstractButton::clicked,(offset_in_QDialog_to_subr *)0x0,CVar12);
  QMetaObject::Connection::~Connection((Connection *)(local_b0 + 8));
  QPushButton::setDefault(this->ok,true);
  pQVar11 = QDialogButtonBox::addButton((QDialogButtonBox *)this->buttons,Cancel);
  this->cancel = pQVar11;
  local_58._0_16_ = ZEXT816(0x1c1);
  QObject::connect<void(QAbstractButton::*)(bool),void(QDialog::*)()>
            ((Object *)local_b0,(offset_in_QAbstractButton_to_subr)pQVar11,
             (ContextType *)QAbstractButton::clicked,(offset_in_QDialog_to_subr *)0x0,CVar12);
  QMetaObject::Connection::~Connection((Connection *)local_b0);
  retranslateStrings(this);
  if (*(QLabel **)(in_FS_OFFSET + 0x28) == (QLabel *)local_40._8_8_) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorDialogPrivate::initWidgets()
{
    Q_Q(QColorDialog);
    QVBoxLayout *mainLay = new QVBoxLayout(q);
    // there's nothing in this dialog that benefits from sizing up
    mainLay->setSizeConstraint(QLayout::SetFixedSize);

    QHBoxLayout *topLay = new QHBoxLayout();
    mainLay->addLayout(topLay);

    leftLay = nullptr;

#if defined(QT_SMALL_COLORDIALOG)
    smallDisplay = true;
    const int lumSpace = 20;
#else
    // small displays (e.g. PDAs) cannot fit the full color dialog,
    // so just use the color picker.
    smallDisplay = (QGuiApplication::primaryScreen()->virtualGeometry().width() < 480 || QGuiApplication::primaryScreen()->virtualGeometry().height() < 350);
    const int lumSpace = topLay->spacing() / 2;
#endif

    if (!smallDisplay) {
        leftLay = new QVBoxLayout;
        topLay->addLayout(leftLay);

        standard = new QColorWell(q, standardColorRows, colorColumns, QColorDialogOptions::standardColors());
        lblBasicColors = new QLabel(q);
#ifndef QT_NO_SHORTCUT
        lblBasicColors->setBuddy(standard);
#endif
        QObjectPrivate::connect(standard, &QColorWell::selected,
                                this, &QColorDialogPrivate::newStandard);
        leftLay->addWidget(lblBasicColors);
        leftLay->addWidget(standard);

#if !defined(QT_SMALL_COLORDIALOG)
        if (supportsColorPicking()) {
            eyeDropperButton = new QPushButton();
            leftLay->addWidget(eyeDropperButton);
            lblScreenColorInfo = new QLabel("\n"_L1);
            leftLay->addWidget(lblScreenColorInfo);
            QObjectPrivate::connect(eyeDropperButton, &QPushButton::clicked,
                                    this, &QColorDialogPrivate::pickScreenColor);
        } else {
            eyeDropperButton = nullptr;
            lblScreenColorInfo = nullptr;
        }
#endif

        leftLay->addStretch();

        custom = new QColorWell(q, customColorRows, colorColumns, QColorDialogOptions::customColors());
        custom->setAcceptDrops(true);

        QObjectPrivate::connect(custom, &QColorWell::selected, this, &QColorDialogPrivate::newCustom);
        QObjectPrivate::connect(custom, &QColorWell::currentChanged, this, &QColorDialogPrivate::nextCustom);

        QObject::connect(custom, &QWellArray::colorChanged, q, [this] (int index, QRgb color) {
            QColorDialogOptions::setCustomColor(index, color);
            if (custom)
                custom->update();
        });

        lblCustomColors = new QLabel(q);
#ifndef QT_NO_SHORTCUT
        lblCustomColors->setBuddy(custom);
#endif
        leftLay->addWidget(lblCustomColors);
        leftLay->addWidget(custom);

        addCusBt = new QPushButton(q);
        QObjectPrivate::connect(addCusBt, &QPushButton::clicked, this, &QColorDialogPrivate::addCustom);
        leftLay->addWidget(addCusBt);
    } else {
        // better color picker size for small displays
#if defined(QT_SMALL_COLORDIALOG)
        QSize screenSize = QGuiApplication::screenAt(QCursor::pos())->availableGeometry().size();
        pWidth = pHeight = qMin(screenSize.width(), screenSize.height());
        pHeight -= 20;
        if (screenSize.height() > screenSize.width())
            pWidth -= 20;
#else
        pWidth = 150;
        pHeight = 100;
#endif
        custom = nullptr;
        standard = nullptr;
    }

    QVBoxLayout *rightLay = new QVBoxLayout;
    topLay->addLayout(rightLay);

    QHBoxLayout *pickLay = new QHBoxLayout;
    rightLay->addLayout(pickLay);

    QVBoxLayout *cLay = new QVBoxLayout;
    pickLay->addLayout(cLay);
    cp = new QColorPicker(q);

    cp->setFrameStyle(QFrame::Panel | QFrame::Sunken);

#if defined(QT_SMALL_COLORDIALOG)
    cp->hide();
#else
    cLay->addSpacing(lumSpace);
    cLay->addWidget(cp);
#endif
    cLay->addSpacing(lumSpace);

    lp = new QColorLuminancePicker(q);
#if defined(QT_SMALL_COLORDIALOG)
    lp->hide();
#else
    lp->setFixedWidth(20);
    pickLay->addSpacing(10);
    pickLay->addWidget(lp);
    pickLay->addStretch();
#endif

    QObject::connect(cp, &QColorPicker::newCol, lp, qOverload<int, int>(&QColorLuminancePicker::setCol));
    QObjectPrivate::connect(lp, &QColorLuminancePicker::newHsv, this, &QColorDialogPrivate::newHsv);

    rightLay->addStretch();

    cs = new QColorShower(q);
    pickLay->setContentsMargins(cs->gl->contentsMargins());
    QObjectPrivate::connect(cs, &QColorShower::newCol,
                            this, &QColorDialogPrivate::newColorTypedIn);
    QObject::connect(cs, &QColorShower::currentColorChanged,
                     q, &QColorDialog::currentColorChanged);
#if defined(QT_SMALL_COLORDIALOG)
    topLay->addWidget(cs);
#else
    rightLay->addWidget(cs);
    if (leftLay)
        leftLay->addSpacing(cs->gl->contentsMargins().right());
#endif

    buttons = new QDialogButtonBox(q);
    mainLay->addWidget(buttons);

    ok = buttons->addButton(QDialogButtonBox::Ok);
    QObject::connect(ok, &QPushButton::clicked, q, &QColorDialog::accept);
    ok->setDefault(true);
    cancel = buttons->addButton(QDialogButtonBox::Cancel);
    QObject::connect(cancel, &QPushButton::clicked, q, &QColorDialog::reject);

#ifdef Q_OS_WIN32
    updateTimer = new QTimer(q);
    QObjectPrivate::connect(updateTimer, &QTimer::timeout,
                            this, qOverload<>(&QColorDialogPrivate::updateColorPicking));
#endif
    retranslateStrings();
}